

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O0

void __thiscall
DataSourceDOS::SpriteDosTransparent::SpriteDosTransparent
          (SpriteDosTransparent *this,PBuffer *_data,ColorDOS *palette,uint8_t color)

{
  uchar value;
  undefined1 value_00;
  undefined1 value_01;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  element_type *peVar4;
  element_type *peVar5;
  uint8_t *puVar6;
  uchar local_80;
  uchar uStack_7f;
  ColorDOS color_1;
  uint p_index;
  size_t i;
  size_t fill;
  size_t drop;
  undefined1 local_58 [8];
  PMutableBuffer result;
  shared_ptr<Buffer> local_38;
  byte local_21;
  ColorDOS *pCStack_20;
  uint8_t color_local;
  ColorDOS *palette_local;
  PBuffer *_data_local;
  SpriteDosTransparent *this_local;
  
  local_21 = color;
  pCStack_20 = palette;
  palette_local = (ColorDOS *)_data;
  _data_local = (PBuffer *)this;
  std::shared_ptr<Buffer>::shared_ptr(&local_38,_data);
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,&local_38);
  std::shared_ptr<Buffer>::~shared_ptr(&local_38);
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_001a4df8;
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)local_58);
  while( true ) {
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar1 = Buffer::readable(peVar4);
    if (!bVar1) break;
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar2 = Buffer::pop<unsigned_char>(peVar4);
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    MutableBuffer::push<unsigned_int>(peVar5,0,(ulong)bVar2);
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar2 = Buffer::pop<unsigned_char>(peVar4);
    for (_color_1 = 0; _color_1 < bVar2; _color_1 = _color_1 + 1) {
      peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          _data);
      bVar3 = Buffer::pop<unsigned_char>(peVar4);
      value = pCStack_20[(uint)bVar3 + (uint)local_21].b;
      value_00 = pCStack_20[(uint)bVar3 + (uint)local_21].r;
      value_01 = pCStack_20[(uint)bVar3 + (uint)local_21].g;
      peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar5,value,1);
      peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar5,value_01,1);
      peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar5,value_00,1);
      peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
      MutableBuffer::push<unsigned_char>(peVar5,0xff,1);
    }
  }
  peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_58);
  puVar6 = (uint8_t *)MutableBuffer::unfix(peVar5);
  (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar6;
  std::shared_ptr<MutableBuffer>::~shared_ptr((shared_ptr<MutableBuffer> *)local_58);
  return;
}

Assistant:

DataSourceDOS::SpriteDosTransparent::SpriteDosTransparent(PBuffer _data,
                                                          ColorDOS *palette,
                                                          uint8_t color)
  : SpriteBaseDOS(_data) {
  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    size_t drop = _data->pop<uint8_t>();
    result->push<uint32_t>(0x00000000, drop);

    size_t fill = _data->pop<uint8_t>();
    for (size_t i = 0; i < fill; i++) {
      unsigned int p_index = _data->pop<uint8_t>() + color;  // color_off;
      ColorDOS color = palette[p_index];
      result->push<uint8_t>(color.b);  // Blue
      result->push<uint8_t>(color.g);  // Green
      result->push<uint8_t>(color.r);  // Red
      result->push<uint8_t>(0xFF);     // Alpha
    }
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}